

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O1

int Map_MatchCompare(Map_Man_t *pMan,Map_Match_t *pM1,Map_Match_t *pM2,int fDoingArea)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  fVar1 = pMan->fEpsilon;
  if (fDoingArea == 0) {
    fVar3 = (pM1->tArrive).Worst;
    fVar2 = (pM2->tArrive).Worst;
    if (fVar2 - fVar1 <= fVar3) {
      bVar4 = true;
      if (fVar2 + fVar1 < fVar3) goto LAB_003fe76d;
      if (pM2->AreaFlow - fVar1 <= pM1->AreaFlow) {
        if (fVar1 + pM2->AreaFlow < pM1->AreaFlow) goto LAB_003fe76d;
        uVar10 = *(uint *)&pM1->pSuperBest->field_0x4;
        uVar9 = uVar10 >> 8 & 0xf;
        uVar11 = *(uint *)&pM2->pSuperBest->field_0x4;
        uVar12 = uVar11 >> 8 & 0xf;
        bVar13 = uVar9 < uVar12;
        if (uVar9 <= uVar12) goto LAB_003fe7b0;
      }
    }
  }
  else if (pM2->AreaFlow - fVar1 <= pM1->AreaFlow) {
    if (pM2->AreaFlow + fVar1 < pM1->AreaFlow) {
LAB_003fe65f:
      bVar4 = true;
      goto LAB_003fe76d;
    }
    if ((pMan->fUseProfile != 0) && (pM1->pSuperBest != (Map_Super_t *)0x0)) {
      iVar5 = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
      iVar6 = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
      iVar7 = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
      iVar8 = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
      bVar4 = iVar8 <= iVar6 || iVar5 <= iVar7;
      if ((iVar6 < iVar8 && iVar5 > iVar7) || (iVar8 < iVar6 && iVar5 < iVar7)) goto LAB_003fe76d;
    }
    fVar1 = (pM1->tArrive).Worst;
    fVar3 = (pM2->tArrive).Worst;
    if (fVar3 - pMan->fEpsilon <= fVar1) {
      if (fVar3 + pMan->fEpsilon < fVar1) goto LAB_003fe65f;
      uVar10 = *(uint *)&pM1->pSuperBest->field_0x4;
      uVar9 = uVar10 >> 8 & 0xf;
      uVar11 = *(uint *)&pM2->pSuperBest->field_0x4;
      uVar12 = uVar11 >> 8 & 0xf;
      bVar13 = uVar9 < uVar12;
      if (uVar9 <= uVar12) {
LAB_003fe7b0:
        bVar4 = true;
        if (!bVar13) {
          bVar4 = (uVar11 >> 2 & 7) < (uVar10 >> 2 & 7);
        }
        goto LAB_003fe76d;
      }
    }
  }
  bVar4 = false;
LAB_003fe76d:
  return (int)bVar4;
}

Assistant:

int Map_MatchCompare( Map_Man_t * pMan, Map_Match_t * pM1, Map_Match_t * pM2, int fDoingArea )
{
//    if ( pM1->pSuperBest == pM2->pSuperBest )
//        return 0;
    if ( !fDoingArea )
    {
        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
    else
    {
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;

        // make decision based on cell profile
        if ( pMan->fUseProfile && pM1->pSuperBest && pM1->pSuperBest )
        {
            int M1req = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
            int M2req = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
            int M1act = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
            int M2act = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
            //printf( "%d %d  ", M1req, M2req );
            if ( M1act < M1req && M2act > M2req )
                return 0;
            if ( M2act < M2req && M1act > M1req )
                return 1;
        }

        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
}